

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urandom.cc
# Opt level: O1

void wait_for_entropy(void)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  int *buf;
  bool bVar5;
  uint8_t dummy;
  undefined1 local_11 [9];
  
  if ((urandom_fd == -3) && (getrandom_ready == '\0')) {
    buf = (int *)local_11;
    sVar3 = boringssl_getrandom(buf,1,1);
    if (sVar3 == -1) {
      piVar4 = __errno_location();
      sVar3 = -1;
      if (*piVar4 == 0xb) {
        buf = (int *)local_11;
        wait_for_entropy();
        sVar3 = local_11._1_8_;
      }
    }
    if (sVar3 != 1) {
      wait_for_entropy();
      iVar2 = *buf;
      do {
        if (iVar2 == -1) {
          return;
        }
        LOCK();
        iVar1 = *buf;
        bVar5 = iVar2 == iVar1;
        if (bVar5) {
          *buf = iVar2 + 1;
          iVar1 = iVar2;
        }
        iVar2 = iVar1;
        UNLOCK();
      } while (!bVar5);
      return;
    }
  }
  return;
}

Assistant:

static void wait_for_entropy(void) {
  int fd = urandom_fd;
  if (fd == kHaveGetrandom) {
    // |getrandom| and |getentropy| support blocking in |fill_with_entropy|
    // directly. For |getrandom|, we first probe with a non-blocking call to aid
    // debugging.
#if defined(USE_NR_getrandom)
    if (getrandom_ready) {
      // The entropy pool was already initialized in |init_once|.
      return;
    }

    uint8_t dummy;
    ssize_t getrandom_ret =
        boringssl_getrandom(&dummy, sizeof(dummy), GRND_NONBLOCK);
    if (getrandom_ret == -1 && errno == EAGAIN) {
      // Attempt to get the path of the current process to aid in debugging when
      // something blocks.
      const char *current_process = "<unknown>";
#if defined(OPENSSL_HAS_GETAUXVAL)
      const unsigned long getauxval_ret = getauxval(AT_EXECFN);
      if (getauxval_ret != 0) {
        current_process = (const char *)getauxval_ret;
      }
#endif

      fprintf(
          stderr,
          "%s: getrandom indicates that the entropy pool has not been "
          "initialized. Rather than continue with poor entropy, this process "
          "will block until entropy is available.\n",
          current_process);

      getrandom_ret =
          boringssl_getrandom(&dummy, sizeof(dummy), 0 /* no flags */);
    }

    if (getrandom_ret != 1) {
      perror("getrandom");
      abort();
    }
#endif  // USE_NR_getrandom
    return;
  }
}